

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::rayleigh_dist<float>>(rayleigh_dist<float> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  AssertionHandler *this;
  rayleigh_dist<float> *in_RDI;
  AssertionHandler catchAssertionHandler;
  rayleigh_dist<float> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  char *in_stack_fffffffffffffdc0;
  AssertionHandler *this_00;
  StringRef *macroName;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffde0;
  ExprLhs<bool> *in_stack_fffffffffffffde8;
  AssertionHandler *in_stack_fffffffffffffdf0;
  rayleigh_dist<float> local_1a8 [4];
  stringstream local_198 [16];
  StringRef local_188 [23];
  param_type local_c;
  rayleigh_dist<float> *local_8;
  
  local_8 = in_RDI;
  trng::rayleigh_dist<float>::param_type::param_type(&local_c);
  std::__cxx11::stringstream::stringstream(local_198);
  macroName = local_188;
  this = (AssertionHandler *)trng::rayleigh_dist<float>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde0,
                   (param_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  trng::operator>>(in_stack_fffffffffffffde0,
                   (param_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  trng::rayleigh_dist<float>::rayleigh_dist(local_1a8,&local_c);
  operator____catch_sr
            (in_stack_fffffffffffffdc0,
             CONCAT17(in_stack_fffffffffffffdbf,
                      CONCAT16(in_stack_fffffffffffffdbe,
                               CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))));
  this_00 = (AssertionHandler *)&stack0xfffffffffffffdf0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffffddf;
  capturedExpression.m_start._0_7_ = in_stack_fffffffffffffdd8;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffde0;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             CONCAT13(in_stack_fffffffffffffdbf,
                      CONCAT12(in_stack_fffffffffffffdbe,in_stack_fffffffffffffdbc)));
  bVar1 = trng::operator==((rayleigh_dist<float> *)this_00,
                           (rayleigh_dist<float> *)
                           CONCAT17(in_stack_fffffffffffffdbf,
                                    CONCAT16(in_stack_fffffffffffffdbe,
                                             CONCAT24(in_stack_fffffffffffffdbc,
                                                      in_stack_fffffffffffffdb8))));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffdbe,
                                     CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)))
             ,false);
  Catch::AssertionHandler::handleExpr<bool>(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}